

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *dst,entityfilter_ctx *src)

{
  int iVar1;
  entityfilter_ctx *src_local;
  entityfilter_ctx *dst_local;
  
  if (src == (entityfilter_ctx *)0x0) {
    __assert_fail("src != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x150,
                  "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
                 );
  }
  if (dst != (entityfilter_ctx *)0x0) {
    if (src != dst) {
      iVar1 = src->in_entity;
      dst->buffer_pos = src->buffer_pos;
      dst->in_entity = iVar1;
      *(undefined8 *)dst->buffer = *(undefined8 *)src->buffer;
      *(undefined8 *)(dst->buffer + 8) = *(undefined8 *)(src->buffer + 8);
      *(undefined4 *)(dst->output + 6) = *(undefined4 *)(src->output + 6);
      return;
    }
    __assert_fail("src != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x152,
                  "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
                 );
  }
  __assert_fail("dst != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x151,
                "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
               );
}

Assistant:

void entityfilter_copy(entityfilter_ctx *dst, entityfilter_ctx *src)
{
  assert(src != NULL);
  assert(dst != NULL);
  assert(src != dst);
  memcpy(dst, src, sizeof(entityfilter_ctx));
}